

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

bool __thiscall
httplib::ClientImpl::read_response_line(ClientImpl *this,Stream *strm,Request *req,Response *res)

{
  char *pcVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int extraout_var;
  int extraout_var_00;
  size_t sVar6;
  int extraout_var_01;
  int extraout_var_02;
  int extraout_var_03;
  int extraout_var_04;
  undefined1 **ppuVar7;
  pointer psVar8;
  undefined8 uVar9;
  long lVar10;
  char cVar11;
  long lVar12;
  char byte_1;
  cmatch m;
  array<char,_2048UL> buf;
  char *local_8d8;
  undefined8 local_8d0;
  char local_8c8;
  undefined7 uStack_8c7;
  int *local_8b8;
  Response *local_8b0;
  match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_> local_8a8;
  Stream *local_880;
  undefined1 *local_878;
  long local_870;
  ulong local_868;
  undefined1 *local_860;
  long local_858;
  undefined1 local_850;
  undefined7 uStack_84f;
  char *local_840;
  string *local_838;
  undefined1 local_830 [2048];
  
  local_8b0 = res;
  memset(local_830,0,0x800);
  local_870 = 0x800;
  local_868 = 0;
  local_858 = 0;
  local_850 = 0;
  local_880 = strm;
  local_878 = local_830;
  local_860 = &local_850;
  iVar5 = (*strm->_vptr_Stream[4])(strm,&local_8a8,1);
  lVar10 = CONCAT44(extraout_var,iVar5);
  if (-1 < extraout_var) {
    lVar12 = 0;
    do {
      uVar2 = local_868;
      cVar11 = (char)&local_860;
      if (lVar10 == 0) {
        if (lVar12 != 0) {
LAB_0011b7d6:
          if ((read_response_line(httplib::Stream&,httplib::Request_const&,httplib::Response&)::
               re_abi_cxx11_ == '\0') &&
             (iVar5 = __cxa_guard_acquire(&read_response_line(httplib::Stream&,httplib::Request_const&,httplib::Response&)
                                           ::re_abi_cxx11_), iVar5 != 0)) {
            std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                      (&read_response_line(httplib::Stream&,httplib::Request_const&,httplib::Response&)
                        ::re_abi_cxx11_,"(HTTP/1\\.[01]) (\\d{3})(?: (.*?))?\r?\n",0x10);
            __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                         ~basic_regex,
                         &read_response_line(httplib::Stream&,httplib::Request_const&,httplib::Response&)
                          ::re_abi_cxx11_,&__dso_handle);
            __cxa_guard_release(&read_response_line(httplib::Stream&,httplib::Request_const&,httplib::Response&)
                                 ::re_abi_cxx11_);
          }
          local_8a8.
          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_8a8._M_begin = (char *)0x0;
          local_8a8.
          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_8a8.
          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          ppuVar7 = &local_860;
          if (local_858 == 0) {
            ppuVar7 = &local_878;
          }
          pcVar1 = *ppuVar7;
          sVar6 = strlen(pcVar1);
          bVar3 = std::__detail::
                  __regex_algo_impl<char_const*,std::allocator<std::__cxx11::sub_match<char_const*>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                            (pcVar1,pcVar1 + sVar6,&local_8a8,
                             &read_response_line(httplib::Stream&,httplib::Request_const&,httplib::Response&)
                              ::re_abi_cxx11_,0);
          if (!bVar3) {
            iVar5 = std::__cxx11::string::compare((char *)req);
            bVar3 = iVar5 == 0;
            goto LAB_0011beac;
          }
          lVar10 = (long)local_8a8.
                         super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                         .
                         super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_8a8.
                         super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                         .
                         super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          if ((lVar10 == 0) || (0xfffffffffffffffd < (lVar10 >> 3) * -0x5555555555555555 - 5U)) {
            psVar8 = (pointer)((long)local_8a8.
                                     super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar10 + -0x48);
          }
          else {
            psVar8 = local_8a8.
                     super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                     .
                     super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1;
          }
          if (psVar8->matched == true) {
            local_8d8 = &local_8c8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_8d8,(psVar8->super_pair<const_char_*,_const_char_*>).first,
                       (psVar8->super_pair<const_char_*,_const_char_*>).second);
          }
          else {
            local_8d8 = &local_8c8;
            local_8d0 = 0;
            local_8c8 = '\0';
          }
          std::__cxx11::string::operator=((string *)local_8b0,(string *)&local_8d8);
          if (local_8d8 != &local_8c8) {
            operator_delete(local_8d8,CONCAT71(uStack_8c7,local_8c8) + 1);
          }
          lVar10 = (long)local_8a8.
                         super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                         .
                         super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_8a8.
                         super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                         .
                         super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          if ((lVar10 == 0) || (0xfffffffffffffffc < (lVar10 >> 3) * -0x5555555555555555 - 6U)) {
            psVar8 = (pointer)((long)local_8a8.
                                     super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar10 + -0x48);
          }
          else {
            psVar8 = local_8a8.
                     super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                     .
                     super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 2;
          }
          if (psVar8->matched == true) {
            local_8d8 = &local_8c8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_8d8,(psVar8->super_pair<const_char_*,_const_char_*>).first,
                       (psVar8->super_pair<const_char_*,_const_char_*>).second);
          }
          else {
            local_8d0 = 0;
            local_8c8 = '\0';
            local_8d8 = &local_8c8;
          }
          pcVar1 = local_8d8;
          local_8b8 = __errno_location();
          iVar5 = *local_8b8;
          *local_8b8 = 0;
          lVar10 = strtol(pcVar1,&local_840,10);
          if (local_840 == pcVar1) {
            std::__throw_invalid_argument("stoi");
          }
          else if (((int)lVar10 == lVar10) && (*local_8b8 != 0x22)) {
            if (*local_8b8 == 0) {
              *local_8b8 = iVar5;
            }
            local_8b0->status = (int)lVar10;
            if (local_8d8 != &local_8c8) {
              operator_delete(local_8d8,CONCAT71(uStack_8c7,local_8c8) + 1);
            }
            lVar10 = (long)local_8a8.
                           super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                           .
                           super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_8a8.
                           super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                           .
                           super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            if ((lVar10 == 0) || (0xfffffffffffffffb < (lVar10 >> 3) * -0x5555555555555555 - 7U)) {
              psVar8 = (pointer)((long)local_8a8.
                                       super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                       .
                                       super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar10 + -0x48);
            }
            else {
              psVar8 = local_8a8.
                       super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                       .
                       super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 3;
            }
            if (psVar8->matched == true) {
              local_8d8 = &local_8c8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_8d8,(psVar8->super_pair<const_char_*,_const_char_*>).first
                         ,(psVar8->super_pair<const_char_*,_const_char_*>).second);
            }
            else {
              local_8d0 = 0;
              local_8c8 = '\0';
              local_8d8 = &local_8c8;
            }
            local_838 = (string *)&local_8b0->reason;
            std::__cxx11::string::operator=(local_838,(string *)&local_8d8);
            if (local_8d8 != &local_8c8) {
              operator_delete(local_8d8,CONCAT71(uStack_8c7,local_8c8) + 1);
            }
            bVar3 = true;
            iVar5 = local_8b0->status;
            goto joined_r0x0011ba76;
          }
          std::__throw_out_of_range("stoi");
          goto LAB_0011bf60;
        }
        break;
      }
      if (local_868 < local_870 - 1U) {
        local_868 = local_868 + 1;
        local_878[uVar2] =
             (char)local_8a8.
                   super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   .
                   super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        local_878[local_868] = 0;
      }
      else {
        if (local_858 == 0) {
          std::__cxx11::string::_M_replace((ulong)&local_860,0,(char *)0x0,(ulong)local_878);
        }
        std::__cxx11::string::push_back(cVar11);
      }
      if ((char)local_8a8.
                super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start == '\n') goto LAB_0011b7d6;
      iVar5 = (*local_880->_vptr_Stream[4])(local_880,&local_8a8,1);
      lVar10 = CONCAT44(extraout_var_00,iVar5);
      lVar12 = lVar12 + -1;
    } while (-1 < extraout_var_00);
  }
  bVar3 = false;
LAB_0011bec3:
  if (local_860 != &local_850) {
    operator_delete(local_860,CONCAT71(uStack_84f,local_850) + 1);
  }
  return bVar3;
joined_r0x0011ba76:
  if (iVar5 != 100) goto LAB_0011beac;
  local_868 = 0;
  local_858 = 0;
  *local_860 = 0;
  iVar5 = (*local_880->_vptr_Stream[4])(local_880,&local_8d8,1);
  lVar10 = CONCAT44(extraout_var_01,iVar5);
  if (extraout_var_01 < 0) {
LAB_0011beaa:
    bVar3 = false;
    goto LAB_0011beac;
  }
  lVar12 = 0;
  while (lVar10 != 0) {
    if (local_868 < local_870 - 1U) {
      *(string *)(local_878 + local_868) = local_8d8._0_1_;
      local_878[local_868 + 1] = 0;
      local_868 = local_868 + 1;
    }
    else {
      if (local_858 == 0) {
        std::__cxx11::string::_M_replace((ulong)&local_860,0,(char *)0x0,(ulong)local_878);
      }
      std::__cxx11::string::push_back(cVar11);
    }
    if (local_8d8._0_1_ == (string)0xa) goto LAB_0011bb51;
    iVar5 = (*local_880->_vptr_Stream[4])(local_880,&local_8d8,1);
    lVar10 = CONCAT44(extraout_var_02,iVar5);
    lVar12 = lVar12 + -1;
    if (extraout_var_02 < 0) goto LAB_0011beaa;
  }
  if (lVar12 == 0) goto LAB_0011beaa;
LAB_0011bb51:
  local_868 = 0;
  local_858 = 0;
  *local_860 = 0;
  iVar5 = (*local_880->_vptr_Stream[4])(local_880,&local_8d8,1);
  lVar10 = CONCAT44(extraout_var_03,iVar5);
  if (extraout_var_03 < 0) goto LAB_0011beaa;
  lVar12 = 0;
  while (uVar2 = local_868, lVar10 != 0) {
    if (local_868 < local_870 - 1U) {
      local_868 = local_868 + 1;
      *(string *)(local_878 + uVar2) = local_8d8._0_1_;
      local_878[local_868] = 0;
    }
    else {
      if (local_858 == 0) {
        std::__cxx11::string::_M_replace((ulong)&local_860,0,(char *)0x0,(ulong)local_878);
      }
      std::__cxx11::string::push_back(cVar11);
    }
    if (local_8d8._0_1_ == (string)0xa) goto LAB_0011bc23;
    iVar5 = (*local_880->_vptr_Stream[4])(local_880,&local_8d8,1);
    lVar10 = CONCAT44(extraout_var_04,iVar5);
    lVar12 = lVar12 + -1;
    if (extraout_var_04 < 0) goto LAB_0011beaa;
  }
  if (lVar12 == 0) goto LAB_0011beaa;
LAB_0011bc23:
  ppuVar7 = &local_860;
  if (local_858 == 0) {
    ppuVar7 = &local_878;
  }
  pcVar1 = *ppuVar7;
  sVar6 = strlen(pcVar1);
  bVar4 = std::__detail::
          __regex_algo_impl<char_const*,std::allocator<std::__cxx11::sub_match<char_const*>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                    (pcVar1,pcVar1 + sVar6,&local_8a8,
                     &read_response_line(httplib::Stream&,httplib::Request_const&,httplib::Response&)
                      ::re_abi_cxx11_,0);
  if (!bVar4) goto LAB_0011beaa;
  lVar10 = (long)local_8a8.
                 super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 .
                 super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_8a8.
                 super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 .
                 super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  if ((lVar10 == 0) || (0xfffffffffffffffd < (lVar10 >> 3) * -0x5555555555555555 - 5U)) {
    psVar8 = (pointer)((long)local_8a8.
                             super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             .
                             super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar10 + -0x48);
  }
  else {
    psVar8 = local_8a8.
             super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
             .
             super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1;
  }
  if (psVar8->matched == true) {
    local_8d8 = &local_8c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_8d8,(psVar8->super_pair<const_char_*,_const_char_*>).first,
               (psVar8->super_pair<const_char_*,_const_char_*>).second);
  }
  else {
    local_8d8 = &local_8c8;
    local_8d0 = 0;
    local_8c8 = '\0';
  }
  std::__cxx11::string::operator=((string *)local_8b0,(string *)&local_8d8);
  if (local_8d8 != &local_8c8) {
    operator_delete(local_8d8,CONCAT71(uStack_8c7,local_8c8) + 1);
  }
  lVar10 = (long)local_8a8.
                 super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 .
                 super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_8a8.
                 super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 .
                 super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  if ((lVar10 == 0) || (0xfffffffffffffffc < (lVar10 >> 3) * -0x5555555555555555 - 6U)) {
    psVar8 = (pointer)((long)local_8a8.
                             super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             .
                             super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar10 + -0x48);
  }
  else {
    psVar8 = local_8a8.
             super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
             .
             super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 2;
  }
  if (psVar8->matched == true) {
    local_8d8 = &local_8c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_8d8,(psVar8->super_pair<const_char_*,_const_char_*>).first,
               (psVar8->super_pair<const_char_*,_const_char_*>).second);
  }
  else {
    local_8d8 = &local_8c8;
    local_8d0 = 0;
    local_8c8 = '\0';
  }
  pcVar1 = local_8d8;
  iVar5 = *local_8b8;
  *local_8b8 = 0;
  lVar10 = strtol(local_8d8,&local_840,10);
  if (local_840 == pcVar1) goto LAB_0011bf6c;
  if ((lVar10 - 0x80000000U < 0xffffffff00000000) || (*local_8b8 == 0x22)) goto LAB_0011bf60;
  if (*local_8b8 == 0) {
    *local_8b8 = iVar5;
  }
  local_8b0->status = (int)lVar10;
  if (local_8d8 != &local_8c8) {
    operator_delete(local_8d8,CONCAT71(uStack_8c7,local_8c8) + 1);
  }
  lVar10 = (long)local_8a8.
                 super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 .
                 super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_8a8.
                 super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 .
                 super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  if ((lVar10 == 0) || (0xfffffffffffffffb < (lVar10 >> 3) * -0x5555555555555555 - 7U)) {
    psVar8 = (pointer)((long)local_8a8.
                             super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             .
                             super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar10 + -0x48);
  }
  else {
    psVar8 = local_8a8.
             super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
             .
             super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 3;
  }
  local_8d8 = &local_8c8;
  if (psVar8->matched == true) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_8d8,(psVar8->super_pair<const_char_*,_const_char_*>).first,
               (psVar8->super_pair<const_char_*,_const_char_*>).second);
  }
  else {
    local_8d0 = 0;
    local_8c8 = '\0';
  }
  std::__cxx11::string::operator=(local_838,(string *)&local_8d8);
  if (local_8d8 != &local_8c8) {
    operator_delete(local_8d8,CONCAT71(uStack_8c7,local_8c8) + 1);
  }
  iVar5 = local_8b0->status;
  goto joined_r0x0011ba76;
LAB_0011beac:
  if (local_8a8.
      super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_8a8.
                    super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_8a8.
                          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_8a8.
                          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  goto LAB_0011bec3;
LAB_0011bf60:
  std::__throw_out_of_range("stoi");
LAB_0011bf6c:
  uVar9 = std::__throw_invalid_argument("stoi");
  __cxa_guard_abort(&read_response_line(httplib::Stream&,httplib::Request_const&,httplib::Response&)
                     ::re_abi_cxx11_);
  if (local_860 != &local_850) {
    operator_delete(local_860,CONCAT71(uStack_84f,local_850) + 1);
  }
  _Unwind_Resume(uVar9);
}

Assistant:

inline bool ClientImpl::read_response_line(Stream& strm, const Request& req,
        Response& res) {
        std::array<char, 2048> buf{};

        detail::stream_line_reader line_reader(strm, buf.data(), buf.size());

        if (!line_reader.getline()) { return false; }

    #ifdef CPPHTTPLIB_ALLOW_LF_AS_LINE_TERMINATOR
        const static std::regex re("(HTTP/1\\.[01]) (\\d{3})(?: (.*?))?\r\n");
    #else
        const static std::regex re("(HTTP/1\\.[01]) (\\d{3})(?: (.*?))?\r?\n");
    #endif

        std::cmatch m;
        if (!std::regex_match(line_reader.ptr(), m, re)) {
            return req.method == "CONNECT";
        }
        res.version = std::string(m[1]);
        res.status = std::stoi(std::string(m[2]));
        res.reason = std::string(m[3]);

        // Ignore '100 Continue'
        while (res.status == 100) {
            if (!line_reader.getline()) { return false; } // CRLF
            if (!line_reader.getline()) { return false; } // next response line

            if (!std::regex_match(line_reader.ptr(), m, re)) { return false; }
            res.version = std::string(m[1]);
            res.status = std::stoi(std::string(m[2]));
            res.reason = std::string(m[3]);
        }

        return true;
    }